

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O1

void ScaleRowDown38_2_Box_SSSE3
               (uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  uint8_t *puVar1;
  bool bVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  uint8_t uVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  uint8_t *puVar19;
  uint8_t *puVar20;
  uint8_t *puVar21;
  uint8_t *puVar22;
  uvec8 auVar23;
  uvec8 auVar24;
  uvec8 auVar25;
  uvec16 auVar26;
  int iVar27;
  undefined1 auVar28 [16];
  undefined4 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  auVar26 = libyuv::kScaleAb2;
  auVar25 = libyuv::kShufAb2;
  auVar24 = libyuv::kShufAb1;
  auVar23 = libyuv::kShufAb0;
  do {
    uVar7 = *src_ptr;
    puVar8 = src_ptr + 1;
    puVar9 = src_ptr + 2;
    puVar10 = src_ptr + 3;
    puVar11 = src_ptr + 4;
    puVar12 = src_ptr + 5;
    puVar13 = src_ptr + 6;
    puVar14 = src_ptr + 7;
    puVar15 = src_ptr + 8;
    puVar16 = src_ptr + 9;
    puVar17 = src_ptr + 10;
    puVar18 = src_ptr + 0xb;
    puVar19 = src_ptr + 0xc;
    puVar20 = src_ptr + 0xd;
    puVar21 = src_ptr + 0xe;
    puVar22 = src_ptr + 0xf;
    puVar1 = src_ptr + src_stride;
    src_ptr = src_ptr + 0x10;
    auVar28[0] = pavgb(uVar7,*puVar1);
    auVar28[1] = pavgb(*puVar8,puVar1[1]);
    auVar28[2] = pavgb(*puVar9,puVar1[2]);
    auVar28[3] = pavgb(*puVar10,puVar1[3]);
    auVar28[4] = pavgb(*puVar11,puVar1[4]);
    auVar28[5] = pavgb(*puVar12,puVar1[5]);
    auVar28[6] = pavgb(*puVar13,puVar1[6]);
    auVar28[7] = pavgb(*puVar14,puVar1[7]);
    auVar28[8] = pavgb(*puVar15,puVar1[8]);
    auVar28[9] = pavgb(*puVar16,puVar1[9]);
    auVar28[10] = pavgb(*puVar17,puVar1[10]);
    auVar28[0xb] = pavgb(*puVar18,puVar1[0xb]);
    auVar28[0xc] = pavgb(*puVar19,puVar1[0xc]);
    auVar28[0xd] = pavgb(*puVar20,puVar1[0xd]);
    auVar28[0xe] = pavgb(*puVar21,puVar1[0xe]);
    auVar28[0xf] = pavgb(*puVar22,puVar1[0xf]);
    auVar30 = pshufb(auVar28,(undefined1  [16])auVar23);
    auVar31 = pshufb(auVar28,(undefined1  [16])auVar24);
    auVar30 = paddusw(auVar30,auVar31);
    auVar28 = pshufb(auVar28,(undefined1  [16])auVar25);
    auVar28 = paddusw(auVar30,auVar28);
    auVar28 = pmulhuw(auVar28,(undefined1  [16])auVar26);
    sVar3 = auVar28._0_2_;
    sVar4 = auVar28._2_2_;
    sVar5 = auVar28._4_2_;
    sVar6 = auVar28._6_2_;
    uVar29 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar28[6] - (0xff < sVar6),
                      CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar28[4] - (0xff < sVar5),
                               CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar28[2] - (0xff < sVar4),
                                        (0 < sVar3) * (sVar3 < 0x100) * auVar28[0] - (0xff < sVar3))
                              ));
    sVar3 = auVar28._8_2_;
    sVar4 = auVar28._10_2_;
    *(undefined4 *)dst_ptr = uVar29;
    *(int *)(dst_ptr + 2) =
         (int)(CONCAT15((0 < sVar4) * (sVar4 < 0x100) * auVar28[10] - (0xff < sVar4),
                        CONCAT14((0 < sVar3) * (sVar3 < 0x100) * auVar28[8] - (0xff < sVar3),uVar29)
                       ) >> 0x10);
    dst_ptr = dst_ptr + 6;
    iVar27 = dst_width + -6;
    bVar2 = 5 < dst_width;
    dst_width = iVar27;
  } while (iVar27 != 0 && bVar2);
  return;
}

Assistant:

void ScaleRowDown38_2_Box_SSSE3(const uint8_t* src_ptr,
                                ptrdiff_t src_stride,
                                uint8_t* dst_ptr,
                                int dst_width) {
  asm volatile(
      "movdqa      %0,%%xmm2                     \n"
      "movdqa      %1,%%xmm3                     \n"
      "movdqa      %2,%%xmm4                     \n"
      "movdqa      %3,%%xmm5                     \n"
      :
      : "m"(kShufAb0),  // %0
        "m"(kShufAb1),  // %1
        "m"(kShufAb2),  // %2
        "m"(kScaleAb2)  // %3
  );
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x00(%0,%3,1),%%xmm1          \n"
      "lea         0x10(%0),%0                   \n"
      "pavgb       %%xmm1,%%xmm0                 \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "pshufb      %%xmm2,%%xmm1                 \n"
      "movdqa      %%xmm0,%%xmm6                 \n"
      "pshufb      %%xmm3,%%xmm6                 \n"
      "paddusw     %%xmm6,%%xmm1                 \n"
      "pshufb      %%xmm4,%%xmm0                 \n"
      "paddusw     %%xmm0,%%xmm1                 \n"
      "pmulhuw     %%xmm5,%%xmm1                 \n"
      "packuswb    %%xmm1,%%xmm1                 \n"
      "movd        %%xmm1,(%1)                   \n"
      "psrlq       $0x10,%%xmm1                  \n"
      "movd        %%xmm1,0x2(%1)                \n"
      "lea         0x6(%1),%1                    \n"
      "sub         $0x6,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_ptr),               // %0
        "+r"(dst_ptr),               // %1
        "+r"(dst_width)              // %2
      : "r"((intptr_t)(src_stride))  // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6");
}